

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int passwd_callback(char *buf,int num,int encrypting,void *global_passwd)

{
  int iVar1;
  size_t uznum;
  int klen;
  void *global_passwd_local;
  int encrypting_local;
  int num_local;
  char *buf_local;
  
  if (encrypting == 0) {
    uznum = strlen((char *)global_passwd);
    iVar1 = curlx_uztosi(uznum);
    if (iVar1 < num) {
      memcpy(buf,global_passwd,(long)(iVar1 + 1));
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int passwd_callback(char *buf, int num, int encrypting,
                           void *global_passwd)
{
  DEBUGASSERT(0 == encrypting);

  if(!encrypting) {
    int klen = curlx_uztosi(strlen((char *)global_passwd));
    if(num > klen) {
      memcpy(buf, global_passwd, klen + 1);
      return klen;
    }
  }
  return 0;
}